

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

void lodepng_compress_settings_init(LodePNGCompressSettings *settings)

{
  LodePNGCompressSettings *settings_local;
  
  settings->btype = 2;
  settings->use_lz77 = 1;
  settings->windowsize = 0x800;
  settings->minmatch = 3;
  settings->nicematch = 0x80;
  settings->lazymatching = 1;
  settings->custom_zlib =
       (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr *)0x0;
  settings->custom_deflate =
       (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr *)0x0;
  settings->custom_context = (void *)0x0;
  return;
}

Assistant:

void lodepng_compress_settings_init(LodePNGCompressSettings* settings)
{
	/*compress with dynamic huffman tree (not in the mathematical sense, just not the predefined one)*/
	settings->btype = 2;
	settings->use_lz77 = 1;
	settings->windowsize = DEFAULT_WINDOWSIZE;
	settings->minmatch = 3;
	settings->nicematch = 128;
	settings->lazymatching = 1;

	settings->custom_zlib = 0;
	settings->custom_deflate = 0;
	settings->custom_context = 0;
}